

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_message.c
# Opt level: O2

char * mqttmessage_getTopicName(MQTT_MESSAGE_HANDLE handle)

{
  LOGGER_LOG p_Var1;
  char *pcVar2;
  
  if (handle == (MQTT_MESSAGE_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = (char *)0x0;
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_message.c"
                ,"mqttmessage_getTopicName",199,1,"Invalid Parameter handle: %p.",0);
    }
  }
  else {
    pcVar2 = handle->topicName;
    if (pcVar2 == (char *)0x0) {
      pcVar2 = handle->const_topic_name;
    }
  }
  return pcVar2;
}

Assistant:

const char* mqttmessage_getTopicName(MQTT_MESSAGE_HANDLE handle)
{
    const char* result;
    if (handle == NULL)
    {
        /* Codes_SRS_MQTTMESSAGE_07_012: [If handle is NULL then mqttmessage_getTopicName shall return a NULL string.] */
        LogError("Invalid Parameter handle: %p.", handle);
        result = NULL;
    }
    else
    {
        /* Codes_SRS_MQTTMESSAGE_07_013: [mqttmessage_getTopicName shall return the topicName contained in MQTT_MESSAGE_HANDLE handle.] */
        if (handle->topicName == NULL)
        {
            result = handle->const_topic_name;
        }
        else
        {
            result = handle->topicName;
        }
    }
    return result;
}